

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
          (RefPtr<wabt::interp::Func> *this,Store *store,Ref ref)

{
  long lVar1;
  long lVar2;
  size_t *psVar3;
  size_t sVar4;
  size_t sVar5;
  Module *pMVar6;
  bool bVar7;
  Index IVar8;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar9;
  Frame *pFVar10;
  Frame *pFVar11;
  size_t *psVar12;
  Ref local_20;
  
  bVar7 = Store::Is<wabt::interp::Func>(store,ref);
  if (bVar7) {
    local_20.index = ref.index;
    IVar8 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar8;
    puVar9 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&store->objects_,ref.index);
    this->obj_ = (Func *)(puVar9->_M_t).
                         super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                         .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    this->store_ = store;
    return;
  }
  interp::RefPtr();
  if ((ulong)store >> 0x3a != 0) {
    std::__throw_length_error("vector::reserve");
  }
  lVar1 = *(long *)ref.index;
  if ((Store *)(*(long *)(ref.index + 0x10) - lVar1 >> 5) < store) {
    lVar2 = *(long *)(ref.index + 8);
    pFVar10 = __gnu_cxx::new_allocator<wabt::interp::Frame>::allocate
                        ((new_allocator<wabt::interp::Frame> *)ref.index,(size_type)store,
                         (void *)0x0);
    psVar12 = *(size_t **)ref.index;
    psVar3 = *(size_t **)(ref.index + 8);
    pFVar11 = pFVar10;
    if (psVar12 != psVar3) {
      do {
        sVar4 = *psVar12;
        sVar5 = psVar12[1];
        pMVar6 = (Module *)psVar12[3];
        pFVar11->inst = (Instance *)psVar12[2];
        pFVar11->mod = pMVar6;
        (pFVar11->func).index = sVar4;
        pFVar11->values = (int)sVar5;
        pFVar11->offset = (int)(sVar5 >> 0x20);
        psVar12 = psVar12 + 4;
        pFVar11 = pFVar11 + 1;
      } while (psVar12 != psVar3);
      psVar12 = *(size_t **)ref.index;
    }
    if (psVar12 != (size_t *)0x0) {
      operator_delete(psVar12);
    }
    *(Frame **)ref.index = pFVar10;
    *(long *)(ref.index + 8) = (lVar2 - lVar1) + (long)pFVar10;
    *(Frame **)(ref.index + 0x10) = pFVar10 + (long)store;
  }
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}